

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

char * get_param_name(c2m_ctx_t c2m_ctx,type *param_type,char *name)

{
  MIR_type_t promoted_type;
  char *pcVar1;
  MIR_type_t local_28;
  MIR_type_t type;
  char *name_local;
  type *param_type_local;
  c2m_ctx_t c2m_ctx_local;
  
  if ((param_type->mode == TM_STRUCT) || (param_type->mode == TM_UNION)) {
    local_28 = MIR_T_I64;
  }
  else {
    local_28 = get_mir_type(c2m_ctx,param_type);
  }
  promoted_type = promote_mir_int_type(local_28);
  pcVar1 = get_reg_var_name(c2m_ctx,promoted_type,name,0);
  return pcVar1;
}

Assistant:

static const char *get_param_name (c2m_ctx_t c2m_ctx, struct type *param_type, const char *name) {
  MIR_type_t type = (param_type->mode == TM_STRUCT || param_type->mode == TM_UNION
                       ? MIR_POINTER_TYPE
                       : get_mir_type (c2m_ctx, param_type));
  return get_reg_var_name (c2m_ctx, promote_mir_int_type (type), name, 0);
}